

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

iterator __thiscall
llvm::SmallVectorImpl<char_const*>::insert<char_const**,void>
          (SmallVectorImpl<char_const*> *this,iterator I,char **From,char **To)

{
  move_iterator<const_char_**> in_end;
  long lVar1;
  long lVar2;
  iterator ppcVar3;
  ulong uVar4;
  size_t MinCapacity;
  ulong uVar5;
  long lVar6;
  size_t __n;
  ulong uVar7;
  
  ppcVar3 = *(iterator *)this;
  lVar6 = (long)I - (long)ppcVar3;
  if (ppcVar3 + *(uint *)(this + 8) == I) {
    append<char_const**,void>(this,From,To);
    ppcVar3 = (iterator)(lVar6 + *(long *)this);
  }
  else {
    if (I < ppcVar3) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    if (ppcVar3 + *(uint *)(this + 8) < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    uVar5 = (long)To - (long)From >> 3;
    MinCapacity = *(uint *)(this + 8) + uVar5;
    if (*(uint *)(this + 0xc) < MinCapacity) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,MinCapacity,8);
    }
    lVar2 = *(long *)this;
    ppcVar3 = (iterator)(lVar2 + lVar6);
    uVar4 = (ulong)*(uint *)(this + 8);
    lVar1 = uVar4 * 8;
    in_end._M_current = (char **)(lVar2 + uVar4 * 8);
    uVar7 = lVar1 - lVar6 >> 3;
    if (uVar7 < uVar5) {
      uVar5 = uVar5 + uVar4;
      if (*(uint *)(this + 0xc) < uVar5) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      *(int *)(this + 8) = (int)uVar5;
      if (lVar1 - lVar6 != 0) {
        memcpy((void *)(lVar2 + (uVar5 & 0xffffffff) * 8 + uVar7 * -8),ppcVar3,lVar1 - lVar6);
      }
      if (lVar1 != lVar6) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          ppcVar3[uVar5] = From[uVar5];
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + -8;
        } while (uVar7 != uVar5);
        From = (char **)((long)From - lVar6);
      }
      if (From != To) {
        memcpy(in_end._M_current,From,(long)To - (long)From);
      }
    }
    else {
      append<std::move_iterator<char_const**>,void>
                (this,(move_iterator<const_char_**>)(in_end._M_current + -uVar5),in_end);
      __n = (long)(in_end._M_current + -uVar5) - (long)ppcVar3;
      if (__n != 0) {
        memmove((void *)((long)in_end._M_current - __n),ppcVar3,__n);
      }
      if (To != From) {
        ppcVar3 = (iterator)memmove(ppcVar3,From,(long)To - (long)From);
        return ppcVar3;
      }
    }
  }
  return ppcVar3;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }